

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotatedPagesPDF.cpp
# Opt level: O2

int RotatedPagesPDF(int argc,char **argv)

{
  list<unsigned_long,_std::allocator<unsigned_long>_> *this;
  EStatusCode EVar1;
  EncryptionOptions *pEVar2;
  BoolAndInt *pBVar3;
  PageContentContext *inPageContext;
  LogConfiguration *inLogConfiguration;
  PDFParsingOptions *pPVar4;
  IByteReaderWithPosition *inSourceStream;
  unsigned_long uVar5;
  ostream *poVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong inPageIndex;
  bool bVar11;
  allocator<char> local_1821;
  PDFPageInput input;
  EStatusCodeAndObjectIDTypeList result;
  _List_base<unsigned_long,_std::allocator<unsigned_long>_> local_17e0;
  RefCountPtr<PDFDictionary> page_1;
  TextOptions textOptions;
  LogConfiguration logConfiguration;
  InputFile pdfFile;
  EncryptionOptions local_15d0;
  EncryptionOptions local_1580;
  PDFParser pdfParser;
  PDFWriter pdfWriter;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pdfParser,"RotatedPagesLog.txt",(allocator<char> *)&pdfFile);
  BuildRelativeOutputPath((string *)&pdfWriter,argv,(string *)&pdfParser);
  uVar8 = 1;
  LogConfiguration::LogConfiguration(&logConfiguration,true,true,(string *)&pdfWriter);
  std::__cxx11::string::~string((string *)&pdfWriter);
  std::__cxx11::string::~string((string *)&pdfParser);
  PDFWriter::PDFWriter(&pdfWriter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&textOptions,"RotatedPages.pdf",(allocator<char> *)&result);
  BuildRelativeOutputPath(&pdfFile.mFilePath,argv,(string *)&textOptions);
  pEVar2 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_1580,pEVar2);
  EncryptionOptions::EncryptionOptions((EncryptionOptions *)&pdfParser.mObjectParser,&local_1580);
  pdfParser._vptr_PDFParser._0_2_ = 0x101;
  pdfParser.mObjectParser.mDecryptionHelper._0_1_ = 0;
  EVar1 = PDFWriter::StartPDF(&pdfWriter,&pdfFile.mFilePath,ePDFVersion13,&logConfiguration,
                              (PDFCreationSettings *)&pdfParser);
  EncryptionOptions::~EncryptionOptions((EncryptionOptions *)&pdfParser.mObjectParser);
  EncryptionOptions::~EncryptionOptions(&local_1580);
  std::__cxx11::string::~string((string *)&pdfFile);
  std::__cxx11::string::~string((string *)&textOptions);
  if (EVar1 == eSuccess) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&input,"fonts/arial.ttf",(allocator<char> *)&local_17e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pdfFile,argv[1],(allocator<char> *)&page_1);
    LocalPathToFileURL((FileURL *)&pdfParser,&pdfFile.mFilePath);
    RelativeURLToLocalPath((string *)&result,(FileURL *)&pdfParser,(string *)&input);
    FileURL::~FileURL((FileURL *)&pdfParser);
    std::__cxx11::string::~string((string *)&pdfFile);
    iVar10 = 0;
    textOptions.font = PDFWriter::GetFontForFile(&pdfWriter,(string *)&result,0);
    textOptions.fontSize = 14.0;
    textOptions.colorSpace = eGray;
    textOptions.colorValue = 0;
    textOptions.opacity = 255.0;
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&input);
    EVar1 = eSuccess;
    uVar8 = 0;
    do {
      if ((EVar1 != eSuccess) || (5 < uVar8)) break;
      PDFPage::PDFPage((PDFPage *)&pdfParser);
      PDFRectangle::PDFRectangle((PDFRectangle *)&pdfFile,0.0,0.0,595.0,842.0);
      PDFPage::SetMediaBox((PDFPage *)&pdfParser,(PDFRectangle *)&pdfFile);
      PDFRectangle::~PDFRectangle((PDFRectangle *)&pdfFile);
      std::operator<<((ostream *)&std::cout,"Setting invalid rotation to 33\n");
      PDFPage::SetRotate((PDFPage *)&pdfParser,0x21);
      pBVar3 = PDFPage::GetRotate((PDFPage *)&pdfParser);
      if (pBVar3->second == 0) {
        std::operator<<((ostream *)&std::cout,"success in failing to apply invalid rotation\n");
        PDFPage::SetRotate((PDFPage *)&pdfParser,iVar10);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pdfFile);
        poVar6 = std::operator<<((ostream *)&pdfFile,"Page rotated by ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar10);
        std::operator<<(poVar6," degrees.");
        inPageContext = PDFWriter::StartPageContentContext(&pdfWriter,(PDFPage *)&pdfParser);
        std::__cxx11::stringbuf::str();
        AbstractContentContext::WriteText
                  (&inPageContext->super_AbstractContentContext,75.0,805.0,(string *)&result,
                   &textOptions);
        std::__cxx11::string::~string((string *)&result);
        EVar1 = PDFWriter::EndPageContentContext(&pdfWriter,inPageContext);
        bVar11 = EVar1 == eSuccess;
        if (bVar11) {
          EVar1 = PDFWriter::WritePage(&pdfWriter,(PDFPage *)&pdfParser);
          if (EVar1 == eSuccess) {
            EVar1 = eSuccess;
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cout,"failed to write page ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar8);
            std::operator<<(poVar6,"\n");
          }
        }
        else {
          std::operator<<((ostream *)&std::cout,"Failed to end content context\n");
          EVar1 = eFailure;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pdfFile);
      }
      else {
        std::operator<<((ostream *)&std::cout,"Failed to reject invalid rotation\n");
        bVar11 = false;
        EVar1 = eFailure;
      }
      PDFPage::~PDFPage((PDFPage *)&pdfParser);
      uVar8 = uVar8 + 1;
      iVar10 = iVar10 + 0x5a;
    } while (bVar11);
    EVar1 = PDFWriter::EndPDF(&pdfWriter);
    if (EVar1 == eSuccess) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,"RotatedPagesCopy.pdf",(allocator<char> *)&input);
      BuildRelativeOutputPath(&pdfFile.mFilePath,argv,(string *)&result);
      inLogConfiguration = LogConfiguration::DefaultLogConfiguration();
      pEVar2 = EncryptionOptions::DefaultEncryptionOptions();
      EncryptionOptions::EncryptionOptions(&local_15d0,pEVar2);
      EncryptionOptions::EncryptionOptions
                ((EncryptionOptions *)&pdfParser.mObjectParser,&local_15d0);
      pdfParser._vptr_PDFParser._0_2_ = 0x101;
      pdfParser.mObjectParser.mDecryptionHelper._0_1_ = 0;
      EVar1 = PDFWriter::StartPDF(&pdfWriter,&pdfFile.mFilePath,ePDFVersion13,inLogConfiguration,
                                  (PDFCreationSettings *)&pdfParser);
      EncryptionOptions::~EncryptionOptions((EncryptionOptions *)&pdfParser.mObjectParser);
      EncryptionOptions::~EncryptionOptions(&local_15d0);
      std::__cxx11::string::~string((string *)&pdfFile);
      std::__cxx11::string::~string((string *)&result);
      if (EVar1 == eSuccess) {
        this = &result.second;
        result.first = eSuccess;
        result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        _M_node._M_size = 0;
        result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        _M_node.super__List_node_base._M_next = (_List_node_base *)this;
        result.second.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        _M_node.super__List_node_base._M_prev = (_List_node_base *)this;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&input,"RotatedPages.pdf",&local_1821);
        BuildRelativeOutputPath(&pdfFile.mFilePath,argv,(string *)&input);
        page_1._vptr_RefCountPtr = (_func_int **)((ulong)page_1._vptr_RefCountPtr._4_4_ << 0x20);
        local_17e0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_17e0;
        local_17e0._M_impl._M_node._M_size = 0;
        local_17e0._M_impl._M_node.super__List_node_base._M_prev =
             local_17e0._M_impl._M_node.super__List_node_base._M_next;
        page_1.mValue = (PDFDictionary *)&page_1.mValue;
        pPVar4 = PDFParsingOptions::DefaultPDFParsingOptions();
        PDFWriter::AppendPDFPagesFromPDF
                  ((EStatusCodeAndObjectIDTypeList *)&pdfParser,&pdfWriter,&pdfFile.mFilePath,
                   (PDFPageRange *)&page_1,(ObjectIDTypeList *)&local_17e0,pPVar4);
        std::
        pair<PDFHummus::EStatusCode,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator=(&result,(type)&pdfParser);
        std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
                  ((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                   &pdfParser.mObjectParser);
        std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
                  (&local_17e0);
        std::__cxx11::
        _List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::_M_clear((_List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)&page_1.mValue);
        std::__cxx11::string::~string((string *)&pdfFile);
        std::__cxx11::string::~string((string *)&input);
        if (result.first == eSuccess) {
          EVar1 = PDFWriter::EndPDF(&pdfWriter);
          if (EVar1 == eSuccess) {
            InputFile::InputFile(&pdfFile);
            PDFParser::PDFParser(&pdfParser);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&page_1,"RotatedPagesCopy.pdf",(allocator<char> *)&local_17e0);
            BuildRelativeOutputPath((string *)&input,argv,(string *)&page_1);
            EVar1 = InputFile::OpenFile(&pdfFile,(string *)&input);
            std::__cxx11::string::~string((string *)&input);
            std::__cxx11::string::~string((string *)&page_1);
            if (EVar1 == eSuccess) {
              inSourceStream = InputFile::GetInputStream(&pdfFile);
              pPVar4 = PDFParsingOptions::DefaultPDFParsingOptions();
              EVar1 = PDFParser::StartPDFParsing(&pdfParser,inSourceStream,pPVar4);
              if (EVar1 == eSuccess) {
                uVar5 = PDFParser::GetPagesCount(&pdfParser);
                if (uVar5 == 6) {
                  lVar9 = 0;
                  EVar1 = eSuccess;
                  inPageIndex = 0;
                  do {
                    uVar5 = PDFParser::GetPagesCount(&pdfParser);
                    if ((EVar1 != eSuccess) || (uVar5 <= inPageIndex)) break;
                    page_1.mValue = PDFParser::ParsePage(&pdfParser,inPageIndex);
                    page_1._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d830;
                    if (page_1.mValue == (PDFDictionary *)0x0) {
                      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                      std::operator<<(poVar6,". page parsing failed\n");
                      bVar11 = false;
                      EVar1 = eFailure;
                    }
                    else {
                      PDFPageInput::PDFPageInput(&input,&pdfParser,&page_1);
                      iVar10 = PDFPageInput::GetRotate(&input);
                      EVar1 = eSuccess;
                      bVar11 = lVar9 == iVar10;
                      if (!bVar11) {
                        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                        std::operator<<(poVar6,". page has invalid rotation\n");
                        EVar1 = eFailure;
                      }
                      PDFPageInput::~PDFPageInput(&input);
                    }
                    RefCountPtr<PDFDictionary>::~RefCountPtr(&page_1);
                    inPageIndex = inPageIndex + 1;
                    lVar9 = lVar9 + 0x5a;
                  } while (bVar11);
                }
                else {
                  poVar6 = std::operator<<((ostream *)&std::cout,"expecting 6 pages, got ");
                  PDFParser::GetPagesCount(&pdfParser);
                  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
                  std::operator<<(poVar6,"\n");
                  EVar1 = eFailure;
                }
              }
              else {
                std::operator<<((ostream *)&std::cout,"unable to parse input file");
              }
            }
            else {
              std::operator<<((ostream *)&std::cout,
                              "unable to open file RotatedPagesCopy.pdf for reading.\n");
            }
            PDFParser::~PDFParser(&pdfParser);
            InputFile::~InputFile(&pdfFile);
          }
          else {
            std::operator<<((ostream *)&std::cout,"failed in end RotatedPagesCopy.pdf\n");
            EVar1 = 1;
          }
        }
        else {
          std::operator<<((ostream *)&std::cout,"failed to append pages from RotatedPages.pdf\n");
          EVar1 = result.first;
        }
        std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear
                  (&this->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>);
        uVar8 = (uint)(EVar1 != eSuccess);
        goto LAB_00141cda;
      }
      pcVar7 = "failed to start RotatedPagesCopy.pdf\n";
    }
    else {
      pcVar7 = "failed in end RotatedPages.pdf\n";
    }
    std::operator<<((ostream *)&std::cout,pcVar7);
    uVar8 = 1;
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to start RotatedPages.pdf\n");
  }
LAB_00141cda:
  PDFWriter::~PDFWriter(&pdfWriter);
  std::__cxx11::string::~string((string *)&logConfiguration.LogFileLocation);
  return uVar8;
}

Assistant:

int RotatedPagesPDF(int argc, char* argv[])
{
	LogConfiguration logConfiguration(true,true,BuildRelativeOutputPath(argv,"RotatedPagesLog.txt"));
	EStatusCode status; 

	do
	{
		// PDF Page rotation writing

		PDFWriter pdfWriter;
		status = pdfWriter.StartPDF(
			BuildRelativeOutputPath(argv,"RotatedPages.pdf"),
			ePDFVersion13,logConfiguration);

		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start RotatedPages.pdf\n";
			break;
		}	

		AbstractContentContext::TextOptions textOptions(pdfWriter.GetFontForFile(
																			BuildRelativeInputPath(
                                                                            argv,
                                                                            "fonts/arial.ttf")),
																			14,
																			AbstractContentContext::eGray,
																			0);

		for(int i=0;i<6 && PDFHummus::eSuccess == status;++i)
		{
			PDFPage page;
			page.SetMediaBox(PDFRectangle(0,0,595,842));

			cout << "Setting invalid rotation to 33\n";
			page.SetRotate(33);
			if ( page.GetRotate().second != 0 )
			{
				status = PDFHummus::eFailure;
				cout<<"Failed to reject invalid rotation\n";
				break;
			}
			cout << "success in failing to apply invalid rotation\n";

			page.SetRotate(i*90);
		
			std::ostringstream s;
			s << "Page rotated by " << i*90 << " degrees.";

			PageContentContext* cxt = pdfWriter.StartPageContentContext(&page);
			cxt->WriteText(75,805,s.str(),textOptions);
			status = pdfWriter.EndPageContentContext(cxt);
			if(status != eSuccess)
			{
				status = PDFHummus::eFailure;
				cout<<"Failed to end content context\n";
				break;
			}

			status = pdfWriter.WritePage(&page);
			if(status != PDFHummus::eSuccess)
				cout<<"failed to write page "<<i<<"\n";
		}

		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end RotatedPages.pdf\n";
			break;
		}


		// PDF page rotation copy
        
		status = pdfWriter.StartPDF(
			BuildRelativeOutputPath(argv,"RotatedPagesCopy.pdf"),
			ePDFVersion13);

		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed to start RotatedPagesCopy.pdf\n";
			break;
		}
        
		EStatusCodeAndObjectIDTypeList result;
        
        // append pages
		result = pdfWriter.AppendPDFPagesFromPDF(
			BuildRelativeOutputPath(argv,"RotatedPages.pdf"),
			PDFPageRange());

		if(result.first != PDFHummus::eSuccess)
		{
			cout<<"failed to append pages from RotatedPages.pdf\n";
			status = result.first;
			break;
		}
        
		status = pdfWriter.EndPDF();

		if(status != PDFHummus::eSuccess)
		{
			cout<<"failed in end RotatedPagesCopy.pdf\n";
			break;
		}

		// PDF Page rotation parsing

		InputFile pdfFile;
		PDFParser pdfParser;

		status = pdfFile.OpenFile(
			BuildRelativeOutputPath(argv,"RotatedPagesCopy.pdf"));

		if(status != PDFHummus::eSuccess)
		{
			cout<<"unable to open file RotatedPagesCopy.pdf for reading.\n";
			break;
		}

		status = pdfParser.StartPDFParsing(pdfFile.GetInputStream());
		if(status != PDFHummus::eSuccess)
		{
			cout<<"unable to parse input file";
			break;
		}

		if(pdfParser.GetPagesCount() != 6)
		{
			cout<<"expecting 6 pages, got "<<pdfParser.GetPagesCount()<<"\n";
			status = PDFHummus::eFailure;
			break;
		}

		for(unsigned long i=0;i<pdfParser.GetPagesCount() && PDFHummus::eSuccess == status;++i)
		{
			RefCountPtr<PDFDictionary> page = pdfParser.ParsePage(i);
			if (!page)
			{
				cout << i << ". page parsing failed\n";
				status = PDFHummus::eFailure;
				break;
			}

			PDFPageInput input( &pdfParser, page );
			if ( input.GetRotate() != i*90 )
			{
				cout<< i << ". page has invalid rotation\n";
				status = PDFHummus::eFailure;
				break;
			}
		}

	}while(false);
	return status == eSuccess ? 0:1;
}